

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.h
# Opt level: O2

QEasingCurve * __thiscall QEasingCurve::operator=(QEasingCurve *this,QEasingCurve *other)

{
  QEasingCurvePrivate *pQVar1;
  long in_FS_OFFSET;
  QEasingCurve copy;
  QEasingCurve local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this != other) {
    local_20.d_ptr = (QEasingCurvePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QEasingCurve(&local_20,other);
    pQVar1 = this->d_ptr;
    this->d_ptr = (QEasingCurvePrivate *)local_20;
    local_20.d_ptr = pQVar1;
    ~QEasingCurve(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QEasingCurve &operator=(const QEasingCurve &other)
    { if ( this != &other ) { QEasingCurve copy(other); swap(copy); } return *this; }